

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool ImGui_EndFrame(SDL_Window *window)

{
  ImDrawData *pIVar1;
  int display_h;
  int display_w;
  undefined4 local_20;
  undefined4 local_1c;
  
  SDL_GetWindowSize(window,&local_1c,&local_20);
  glViewport(0,0,local_1c,local_20);
  glClearColor(0,0,0,0x3ecccccd);
  glClear(0x4000);
  ImGui::Render();
  pIVar1 = (ImDrawData *)ImGui::GetDrawData();
  ImGui_RenderDrawData(pIVar1);
  SDL_GL_SwapWindow(window);
  return true;
}

Assistant:

bool ImGui_EndFrame(SDL_Window * window) {
    // Rendering
    int display_w, display_h;
    SDL_GetWindowSize(window, &display_w, &display_h);
    glViewport(0, 0, display_w, display_h);
    glClearColor(0.0f, 0.0f, 0.0f, 0.4f);
    glClear(GL_COLOR_BUFFER_BIT);

    ImGui::Render();
    ImGui_RenderDrawData(ImGui::GetDrawData());

    SDL_GL_SwapWindow(window);

    return true;
}